

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O0

void __thiscall
KMaxDistance::addFurtherPathToNodeAVL
          (KMaxDistance *this,MaxRec *srcRec,int idxOfDstPix,double edgeCost,int numDistMaxs,
          MaxRec **maxs,NodeAVL **queue)

{
  long lVar1;
  int iVar2;
  MaxRec *__ptr;
  NodeAVL *pNVar3;
  int in_EDX;
  void *in_RSI;
  NodeAVL *in_RDI;
  long in_R8;
  int i;
  MaxRec *recToOverWrite;
  int compare;
  MaxRec *recsToOverWrite [2000];
  int numRecsToOverwrite;
  MaxRec *tmpRec;
  MaxRec *dstRec;
  undefined4 in_stack_ffffffffffffc110;
  undefined4 in_stack_ffffffffffffc114;
  MaxRec *in_stack_ffffffffffffc118;
  undefined4 in_stack_ffffffffffffc120;
  undefined4 in_stack_ffffffffffffc124;
  int iVar4;
  MaxRec *in_stack_ffffffffffffc128;
  MaxRec *in_stack_ffffffffffffc130;
  KMaxDistance *in_stack_ffffffffffffc138;
  int local_4c;
  
  lVar1 = *(long *)(in_R8 + (long)in_EDX * 8);
  __ptr = createNewMaxRec((KMaxDistance *)
                          CONCAT44(in_stack_ffffffffffffc124,in_stack_ffffffffffffc120),
                          (int)((ulong)in_stack_ffffffffffffc118 >> 0x20),
                          (int)in_stack_ffffffffffffc118);
  __ptr->back = in_RSI;
  copyVals((KMaxDistance *)CONCAT44(in_stack_ffffffffffffc124,in_stack_ffffffffffffc120),
           in_stack_ffffffffffffc118,
           (MaxRec *)CONCAT44(in_stack_ffffffffffffc114,in_stack_ffffffffffffc110));
  modifyDstMaxs((KMaxDistance *)CONCAT44(in_stack_ffffffffffffc124,in_stack_ffffffffffffc120),
                in_stack_ffffffffffffc118,
                (double)CONCAT44(in_stack_ffffffffffffc114,in_stack_ffffffffffffc110));
  iVar2 = compareVecOfMaxsWithAllVecsInNode
                    (in_stack_ffffffffffffc138,in_stack_ffffffffffffc130,in_stack_ffffffffffffc128,
                     (MaxRec **)CONCAT44(in_stack_ffffffffffffc124,in_stack_ffffffffffffc120),
                     (int *)in_stack_ffffffffffffc118);
  if (iVar2 == 2) {
    in_stack_ffffffffffffc128->back = in_RSI;
    iVar4 = iVar2;
    copyVals((KMaxDistance *)CONCAT44(2,in_stack_ffffffffffffc120),in_stack_ffffffffffffc128,
             (MaxRec *)CONCAT44(in_stack_ffffffffffffc114,2));
    if (in_stack_ffffffffffffc128->wasMin == 0) {
      avlUpdateNode((NodeAVL **)CONCAT44(in_stack_ffffffffffffc114,iVar2),in_RDI,
                    5.39810689924042e-318);
    }
    else {
      pNVar3 = avlInsert((NodeAVL **)CONCAT44(iVar4,in_stack_ffffffffffffc120),
                         (double)in_stack_ffffffffffffc128,
                         (void *)CONCAT44(in_stack_ffffffffffffc114,iVar2));
      in_stack_ffffffffffffc128->qPtr = pNVar3;
    }
    free(__ptr);
    in_RDI->id = in_RDI->id + -1;
    for (iVar2 = 1; iVar2 < local_4c; iVar2 = iVar2 + 1) {
      *(undefined4 *)(*(long *)(&stack0xffffffffffffc128 + (long)iVar2 * 8) + 0x10) = 0;
    }
    in_RDI->id = (in_RDI->id - local_4c) + 1;
  }
  else if (iVar2 == 3) {
    __ptr->next = *(void **)(in_R8 + (long)*(int *)(lVar1 + 0x20) * 8);
    pNVar3 = avlInsert((NodeAVL **)CONCAT44(3,in_stack_ffffffffffffc120),
                       (double)in_stack_ffffffffffffc118,
                       (void *)CONCAT44(in_stack_ffffffffffffc114,3));
    __ptr->qPtr = pNVar3;
    *(MaxRec **)(in_R8 + (long)*(int *)(lVar1 + 0x20) * 8) = __ptr;
  }
  else {
    free(__ptr);
    in_RDI->id = in_RDI->id + -1;
  }
  return;
}

Assistant:

void KMaxDistance::addFurtherPathToNodeAVL( MaxRec *srcRec, const int idxOfDstPix, const double edgeCost,
    const int numDistMaxs, MaxRec **maxs, NodeAVL **queue ){

    MaxRec *dstRec = maxs[idxOfDstPix];

    MaxRec *tmpRec = (MaxRec*)createNewMaxRec( dstRec->imgIdx, numDistMaxs );

    //tmpRec->back = srcRec->imgIdx;
    tmpRec->back = srcRec;
    copyVals( srcRec, tmpRec );
    modifyDstMaxs( tmpRec, edgeCost );
    //printRec( "modif: ", tmpRec, numDistMaxsGl );

    int numRecsToOverwrite;
    MaxRec* recsToOverWrite[MAX_NUM_TO_OVERWRITE];
    int compare = compareVecOfMaxsWithAllVecsInNode( tmpRec, dstRec, recsToOverWrite, &numRecsToOverwrite );
    MaxRec* recToOverWrite;
    //printf( "compare=%d\n", compare );

    switch ( compare ){

      case 2: recToOverWrite = recsToOverWrite[0];
              //recToOverWrite->back = srcRec->imgIdx;
              recToOverWrite->back = srcRec;
              copyVals( tmpRec, recToOverWrite );
              if ( recToOverWrite->wasMin ) recToOverWrite->qPtr = avlInsert( queue, recToOverWrite->sumVals, recToOverWrite );
              else avlUpdateNode( queue, recToOverWrite->qPtr, recToOverWrite->sumVals );
              free( tmpRec ); numMaxRecs--;
              for ( int i = 1; i < numRecsToOverwrite; ++i ) 
              {
                  recsToOverWrite[i]->isUsed = 0;
                  //MaxRec* prec = (MaxRec*)recsToOverWrite[i]->prev;
                  //MaxRec* nrec = (MaxRec*)recsToOverWrite[i]->next;
                  //if(prec != NULL) prec->next = nrec;
                  //if(nrec != NULL) nrec->prev = prec;
                  //free(recsToOverWrite[i]);
              }
              numMaxRecs = numMaxRecs - numRecsToOverwrite + 1;
              break;

      case 3:
              tmpRec->next = maxs[dstRec->imgIdx];
              //maxs[dstRec->imgIdx]->prev = tmpRec;
              tmpRec->qPtr = avlInsert( queue, tmpRec->sumVals, tmpRec );
              maxs[dstRec->imgIdx] = tmpRec;
              break;

      default: free( tmpRec ); numMaxRecs--; break;

    }
    
    #ifdef DEBUG_MODE
    int cnt = getNumMaxRecs( maxs[idxOfDstPix] );
    if ( cnt > numMaxRecsInOneNode ) numMaxRecsInOneNode = cnt;
    #endif

    #ifdef CHECK_NODES
    MaxRec *iRec = maxs[idxOfDstPix];
    while ( iRec != NULL ){
        if ( iRec->isUsed ){
            MaxRec *jRec = (MaxRec*)iRec->next;
            while ( jRec != NULL ){
               if ( jRec->isUsed ){
                   int result = compareTwoVecsOfMaxs( iRec, jRec );
                   if ( result != 3 ){
                       printf( "IS BAD: idxOfDstPix=%6d result=%d cnt=%2d  --->  ", idxOfDstPix, result, cnt );
                       printVals( iRec->vals, iRec->numVals, numDistMaxs );
                       printVals( jRec->vals, jRec->numVals, numDistMaxs );
                       printf( "\n" );
                   }
               }
               jRec = (MaxRec*)jRec->next;
            }
        }
        iRec = (MaxRec*)iRec->next;
    }
    #endif

}